

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExpression.cpp
# Opt level: O3

BaseExpressionPtr __thiscall
Kandinsky::SignExpression::derivative(SignExpression *this,VariableExpressionPtr *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  BaseExpressionPtr BVar2;
  undefined1 local_59;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  undefined1 local_40 [16];
  _Any_data local_30;
  _Manager_type local_20;
  code *local_18;
  
  local_40._0_8_ = &PTR_evaluate_0010fb60;
  local_40._8_8_ = 0.0;
  local_30._8_8_ = 0;
  local_30._M_unused._M_object = defaultFormatter_abi_cxx11_;
  local_18 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(double)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(double),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(double)>
             ::_M_manager;
  local_58 = (Constant *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::Constant,std::allocator<Kandinsky::Constant>,Kandinsky::Constant_const&>
            (a_Stack_50,(Constant **)&local_58,(allocator<Kandinsky::Constant> *)&local_59,
             (Constant *)local_40);
  *(undefined4 *)&(this->super_UnaryExpression).super_BaseExpression._vptr_BaseExpression =
       (undefined4)local_58;
  *(undefined4 *)
   ((long)&(this->super_UnaryExpression).super_BaseExpression._vptr_BaseExpression + 4) =
       local_58._4_4_;
  *(undefined4 *)
   &(this->super_UnaryExpression).m_arg.
    super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       a_Stack_50[0]._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(this->super_UnaryExpression).m_arg.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       a_Stack_50[0]._M_pi._4_4_;
  local_40._0_8_ = &PTR_evaluate_0010fb60;
  _Var1._M_pi = extraout_RDX;
  if (local_20 != (_Manager_type)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr SignExpression::derivative(const VariableExpressionPtr& /*variable*/) const
    {
        return BaseExpression::makePtr(Constant(0));
    }